

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commonutils.cpp
# Opt level: O0

ComponentPtr owningComponent(ParentedEntityConstPtr *entity)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr_access<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RSI;
  ComponentPtr CVar1;
  shared_ptr<libcellml::ParentedEntity> local_28;
  ParentedEntityConstPtr *entity_local;
  
  entity_local = entity;
  std::
  __shared_ptr_access<const_libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->(in_RSI);
  libcellml::ParentedEntity::parent();
  std::dynamic_pointer_cast<libcellml::Component,libcellml::ParentedEntity>
            ((shared_ptr<libcellml::ParentedEntity> *)entity);
  std::shared_ptr<libcellml::ParentedEntity>::~shared_ptr(&local_28);
  CVar1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)entity;
  return (ComponentPtr)CVar1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ComponentPtr owningComponent(const libcellml::ParentedEntityConstPtr &entity)
{
    return std::dynamic_pointer_cast<libcellml::Component>(entity->parent());
}